

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O3

void duckdb::ConstructSortKeyList<duckdb::SortKeyListEntry>
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyConstructInfo *info)

{
  unsafe_vector<idx_t> *puVar1;
  sel_t *psVar2;
  pointer puVar3;
  data_ptr_t pdVar4;
  unsigned_long *puVar5;
  unsigned_long uVar6;
  data_ptr_t pdVar7;
  long lVar8;
  long lVar9;
  SortKeyChunk chunk_00;
  data_t dVar10;
  ulong uVar11;
  reference this;
  type vector_data_00;
  ulong uVar12;
  undefined7 uStack_37;
  
  if (chunk.start < chunk.end) {
    puVar1 = info->offsets;
    do {
      uVar12 = chunk.start;
      if (chunk.has_result_index != false) {
        uVar12 = chunk.result_index;
      }
      psVar2 = ((vector_data->format).sel)->sel_vector;
      uVar11 = chunk.start;
      if (psVar2 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar2[chunk.start];
      }
      puVar3 = (puVar1->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = info->result_data[uVar12];
      puVar5 = (vector_data->format).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if ((puVar5 == (unsigned_long *)0x0) || ((puVar5[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)) {
        dVar10 = vector_data->valid_byte;
        uVar6 = puVar3[uVar12];
        puVar3[uVar12] = uVar6 + 1;
        pdVar4[uVar6] = dVar10;
        pdVar7 = (vector_data->format).data;
        lVar8 = *(long *)(pdVar7 + uVar11 * 0x10 + 8);
        if (lVar8 != 0) {
          lVar9 = *(long *)(pdVar7 + uVar11 * 0x10);
          this = vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
                 ::operator[](&vector_data->child_data,0);
          vector_data_00 =
               unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
               ::operator*(this);
          chunk_00._25_7_ = uStack_37;
          chunk_00.has_result_index = true;
          chunk_00.end = lVar8 + lVar9;
          chunk_00.start = lVar9;
          chunk_00.result_index = uVar12;
          ConstructSortKeyRecursive(vector_data_00,chunk_00,info);
        }
        dVar10 = -info->flip_bytes;
      }
      else {
        dVar10 = vector_data->null_byte;
      }
      uVar6 = puVar3[uVar12];
      puVar3[uVar12] = uVar6 + 1;
      pdVar4[uVar6] = dVar10;
      chunk.start = chunk.start + 1;
    } while (chunk.end != chunk.start);
  }
  return;
}

Assistant:

void ConstructSortKeyList(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyConstructInfo &info) {
	auto &offsets = info.offsets;
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto result_index = chunk.GetResultIndex(r);
		auto idx = vector_data.format.sel->get_index(r);
		auto &offset = offsets[result_index];
		auto result_ptr = info.result_data[result_index];
		if (!vector_data.format.validity.RowIsValid(idx)) {
			// NULL value - write the null byte and skip
			result_ptr[offset++] = vector_data.null_byte;
			if (!OP::IsArray()) {
				// for arrays we always write the child elements - also if the top-level array is NULL
				continue;
			}
		} else {
			// valid value - write the validity byte
			result_ptr[offset++] = vector_data.valid_byte;
		}

		auto list_entry = OP::GetListEntry(vector_data, idx);
		// recurse and write the list elements
		if (list_entry.length > 0) {
			SortKeyChunk child_chunk(list_entry.offset, list_entry.offset + list_entry.length, result_index);
			ConstructSortKeyRecursive(*vector_data.child_data[0], child_chunk, info);
		}

		// write the end-of-list delimiter
		result_ptr[offset++] = static_cast<data_t>(info.flip_bytes ? ~SortKeyVectorData::LIST_DELIMITER
		                                                           : SortKeyVectorData::LIST_DELIMITER);
	}
}